

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

int buffer_pread(int fd,char *s,uint len)

{
  uint64 *puVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  logdir *plVar5;
  ulong uVar6;
  long lVar7;
  
  if (dirn == 0) {
    if (rotateasap == 0) goto LAB_001059db;
  }
  else {
    lVar7 = 0x10;
    uVar6 = 0;
    do {
      buffer_flush((buffer *)((long)&dir->fddir + lVar7));
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0xf0;
    } while (uVar6 < dirn);
    if (rotateasap == 0) goto LAB_001059db;
    if (dirn != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        rotate((logdir *)((long)&dir->fddir + lVar7));
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0xf0;
      } while (uVar6 < dirn);
    }
  }
  rotateasap = 0;
LAB_001059db:
  if (exitasap != 0) {
    if (linecomplete != 0) {
      return 0;
    }
    len = 1;
  }
  if (reopenasap != 0) {
    logdirs_reopen();
    reopenasap = 0;
  }
  taia_now(&now);
  taia_uint(&trotate,0xab8);
  taia_add(&trotate,&now,&trotate);
  if (dirn != 0) {
    lVar7 = 0x68;
    uVar6 = 0;
    plVar5 = dir;
    do {
      if (*(long *)((long)plVar5 + lVar7 + -8) != 0) {
        iVar2 = taia_less((taia *)((long)&plVar5->fddir + lVar7),&now);
        if (iVar2 != 0) {
          rotate((logdir *)((long)dir + lVar7 + -0x68));
        }
        iVar2 = taia_less((taia *)((long)&dir->fddir + lVar7),&trotate);
        plVar5 = dir;
        if (iVar2 != 0) {
          trotate.atto = *(unsigned_long *)((long)&(dir->b).x + lVar7);
          puVar1 = (uint64 *)((long)&dir->fddir + lVar7);
          trotate.sec.x = *puVar1;
          trotate.nano = puVar1[1];
        }
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0xf0;
    } while (uVar6 < dirn);
  }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in,1,&trotate,&now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sVar3 = read(fd,s,(ulong)len);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == error_again) {
      *piVar4 = error_intr;
      iVar2 = -1;
    }
    else {
      iVar2 = -1;
      if (*piVar4 != error_intr) {
        strerr_warn("svlogd: warning: ","unable to read standard input",": ",(char *)0x0,(char *)0x0
                    ,(char *)0x0,&strerr_sys);
      }
    }
  }
  else if (0 < iVar2) {
    linecomplete = (uint)(s[iVar2 - 1] == '\n');
  }
  return iVar2;
}

Assistant:

int buffer_pread(int fd, char *s, unsigned int len) {
  int i;

  for (i =0; i < dirn; ++i) buffer_flush(&dir[i].b);
  if (rotateasap) {
    for (i =0; i < dirn; ++i) rotate(dir +i);
    rotateasap =0;
  }
  if (exitasap) {
    if (linecomplete) return(0);
    len =1;
  }
  if (reopenasap) {
    logdirs_reopen();
    reopenasap =0;
  }
  taia_now(&now);
  taia_uint(&trotate, 2744);
  taia_add(&trotate, &now, &trotate);
  for (i =0; i < dirn; ++i)
    if ((dir +i)->tmax) {
      if (taia_less(&dir[i].trotate, &now)) rotate(dir +i);
      if (taia_less(&dir[i].trotate, &trotate)) trotate =dir[i].trotate;
    }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in, 1, &trotate, &now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  i =read(fd, s, len);
  if (i == -1) {
    if (errno == error_again) errno =error_intr;
    if (errno != error_intr) warn("unable to read standard input");
  }
  if (i > 0) linecomplete =(s[i -1] == '\n');
  return(i);
}